

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

bool __thiscall SslTcpSocketImpl::SetConnectState(SslTcpSocketImpl *this)

{
  SslConnection *pSVar1;
  TcpSocketImpl *szFileName;
  pointer __p;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  pSVar1 = (SslConnection *)operator_new(0x70);
  OpenSSLWrapper::SslConnection::SslConnection(pSVar1,&(this->m_pClientCtx).super_SslContext);
  local_48._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&this->m_pSslCon,pSVar1);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&local_48);
  pSVar1 = (this->m_pSslCon)._M_t.
           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_48._M_unused._0_8_ = 0x11;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(SslTcpSocketImpl **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
             ::_M_manager;
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar1,(function<void_()> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
             fnForwarder_abi_cxx11_);
  szFileName = (TcpSocketImpl *)0x1;
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,1,this);
  if ((this->m_strTrustRootCert)._M_string_length != 0) {
    szFileName = (TcpSocketImpl *)(this->m_strTrustRootCert)._M_dataplus._M_p;
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               (char *)szFileName);
  }
  ConEstablished(this,szFileName);
  return true;
}

Assistant:

bool SslTcpSocketImpl::SetConnectState()
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    ConEstablished(this);
    return true;
}